

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O0

void __thiscall
lf::fe::DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>::
DiffusionElementMatrixProvider
          (DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
           *this,shared_ptr<const_lf::fe::ScalarFESpace<double>_> *fe_space,
          MeshFunctionConstant<double> alpha)

{
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> *fe_space_local;
  DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_> *this_local
  ;
  MeshFunctionConstant<double> alpha_local;
  
  (this->alpha_).value_ = alpha.value_;
  std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::shared_ptr(&this->fe_space_,fe_space);
  quad::QuadRuleCache::QuadRuleCache(&this->qr_cache_);
  return;
}

Assistant:

DiffusionElementMatrixProvider<SCALAR, DIFF_COEFF>::
    DiffusionElementMatrixProvider(
        std::shared_ptr<const ScalarFESpace<SCALAR>> fe_space, DIFF_COEFF alpha)
    : alpha_(std::move(alpha)), fe_space_(std::move(fe_space)) {}